

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

int __thiscall
CVmObjStringBuffer::getp_delete
          (CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int32_t chars;
  int iVar2;
  bool bVar3;
  
  if (oargc == (uint *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = 1 < *oargc;
  }
  if (getp_delete(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_delete(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar1 != 0) {
      getp_delete::desc.min_argc_ = 1;
      getp_delete::desc.opt_argc_ = 2;
      getp_delete::desc.varargs_ = 0;
      __cxa_guard_release(&getp_delete(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_delete::desc);
  if (iVar1 == 0) {
    iVar1 = CVmBif::pop_int_val();
    if (iVar1 < 0) {
      iVar2 = *(int *)(this->super_CVmObject).ext_;
    }
    else {
      iVar2 = -1;
    }
    if (bVar3) {
      chars = CVmBif::pop_int_val();
    }
    else {
      chars = *(int32_t *)(this->super_CVmObject).ext_;
    }
    delete_text(this,self,iVar2 + iVar1,chars,1);
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_delete(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* pop the deletion index and adjust to 0-based or end-based */
    int32_t idx = CVmBif::pop_int_val(vmg0_);
    idx += (idx < 0 ? get_ext()->len : -1);

    /* pop the length, if provided; if not, delete the rest of the string */
    int32_t len;
    if (argc >= 2)
        len = CVmBif::pop_int_val(vmg0_);
    else
        len = get_ext()->len;

    /* do the delete */
    delete_text(vmg_ self, idx, len, TRUE);

    /* handled */
    retval->set_obj(self);
    return TRUE;
}